

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRasterizationTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles2::Functional::anon_unknown_1::LineInterpolationTest::iterate(LineInterpolationTest *this)

{
  size_type *psVar1;
  pointer pVVar2;
  ulong *puVar3;
  float *pfVar4;
  undefined8 uVar5;
  GLenum GVar6;
  TestLog *log;
  undefined1 auVar7 [16];
  size_t **ppsVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  LineInterpolationTest *pLVar11;
  LineInterpolationMethod LVar12;
  long *plVar13;
  undefined8 *puVar14;
  RenderTarget *pRVar15;
  size_t **ppsVar16;
  ulong *puVar17;
  ulong uVar18;
  int iVar19;
  pointer pVVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  bool bVar24;
  float fVar25;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colorBuffer;
  Surface resultImage;
  string iterationDescription;
  ScopedLogSection section;
  SceneLine line;
  undefined1 local_298 [32];
  undefined1 local_278 [32];
  undefined1 local_258 [40];
  LineInterpolationTest *local_230;
  Surface local_228;
  long lStack_210;
  vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_> local_208;
  string local_1f0;
  ScopedLogSection local_1d0;
  undefined1 local_1c8 [8];
  _func_int **pp_Stack_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  float local_1a8 [6];
  float afStack_190 [14];
  ios_base local_158 [8];
  ios_base local_150 [264];
  RasterizationArguments local_48;
  
  iVar19 = this->m_iteration;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  std::ostream::operator<<((ostringstream *)local_1c8,iVar19 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base(local_158);
  plVar13 = (long *)std::__cxx11::string::replace((ulong)local_298,0,(char *)0x0,0x1bccacd);
  ppsVar8 = (size_t **)&local_228.m_pixels.m_cap;
  ppsVar16 = (size_t **)(plVar13 + 2);
  if ((size_t **)*plVar13 == ppsVar16) {
    local_228.m_pixels.m_cap = (size_t)*ppsVar16;
    lStack_210 = plVar13[3];
    local_228._0_8_ = ppsVar8;
  }
  else {
    local_228.m_pixels.m_cap = (size_t)*ppsVar16;
    local_228._0_8_ = (size_t **)*plVar13;
  }
  local_228.m_pixels.m_ptr = (void *)plVar13[1];
  *plVar13 = (long)ppsVar16;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  plVar13 = (long *)std::__cxx11::string::append((char *)&local_228);
  puVar3 = (ulong *)(local_278 + 0x10);
  puVar17 = (ulong *)(plVar13 + 2);
  if ((ulong *)*plVar13 == puVar17) {
    local_278._16_8_ = *puVar17;
    local_278._24_8_ = plVar13[3];
    local_278._0_8_ = puVar3;
  }
  else {
    local_278._16_8_ = *puVar17;
    local_278._0_8_ = (ulong *)*plVar13;
  }
  local_278._8_8_ = plVar13[1];
  *plVar13 = (long)puVar17;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  std::ostream::operator<<(local_1c8,this->m_iterationCount);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base(local_158);
  pVVar2 = (pointer)((long)((Vec4 *)local_278._8_8_)->m_data + (long)(float *)local_258._8_8_);
  pVVar20 = (pointer)0xf;
  if ((ulong *)local_278._0_8_ != puVar3) {
    pVVar20 = (pointer)local_278._16_8_;
  }
  if (pVVar20 < pVVar2) {
    pVVar20 = (pointer)0xf;
    if ((pointer)local_258._0_8_ != (pointer)(local_258 + 0x10)) {
      pVVar20 = (pointer)local_258._16_8_;
    }
    if (pVVar20 < pVVar2) goto LAB_00f61f50;
    puVar14 = (undefined8 *)
              std::__cxx11::string::replace((ulong)local_258,0,(char *)0x0,local_278._0_8_);
  }
  else {
LAB_00f61f50:
    puVar14 = (undefined8 *)std::__cxx11::string::_M_append(local_278,local_258._0_8_);
  }
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  psVar1 = puVar14 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_1f0.field_2._M_allocated_capacity = *psVar1;
    local_1f0.field_2._8_8_ = puVar14[3];
  }
  else {
    local_1f0.field_2._M_allocated_capacity = *psVar1;
    local_1f0._M_dataplus._M_p = (pointer)*puVar14;
  }
  local_1f0._M_string_length = puVar14[1];
  *puVar14 = psVar1;
  puVar14[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((pointer)local_258._0_8_ != (pointer)(local_258 + 0x10)) {
    operator_delete((void *)local_258._0_8_,(ulong)((long)(float *)local_258._16_8_ + 1));
  }
  if ((ulong *)local_278._0_8_ != puVar3) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
  }
  if ((size_t **)local_228._0_8_ != ppsVar8) {
    operator_delete((void *)local_228._0_8_,local_228.m_pixels.m_cap + 1);
  }
  if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
    operator_delete((void *)local_298._0_8_,(ulong)((long)(float *)local_298._16_8_ + 1));
  }
  log = ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
        m_log;
  iVar19 = this->m_iteration;
  local_230 = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  std::ostream::operator<<(local_1c8,iVar19 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base(local_158);
  plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,0x1bcce38);
  pLVar11 = local_230;
  puVar17 = (ulong *)(plVar13 + 2);
  if ((ulong *)*plVar13 == puVar17) {
    local_278._16_8_ = *puVar17;
    local_278._24_8_ = plVar13[3];
    local_278._0_8_ = puVar3;
  }
  else {
    local_278._16_8_ = *puVar17;
    local_278._0_8_ = (ulong *)*plVar13;
  }
  local_278._8_8_ = plVar13[1];
  *plVar13 = (long)puVar17;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  tcu::ScopedLogSection::ScopedLogSection(&local_1d0,log,(string *)local_278,&local_1f0);
  if ((ulong *)local_278._0_8_ != puVar3) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
  }
  if ((size_t **)local_228._0_8_ != ppsVar8) {
    operator_delete((void *)local_228._0_8_,local_228.m_pixels.m_cap + 1);
  }
  iVar19 = (pLVar11->super_BaseRenderingCase).m_renderSize;
  tcu::Surface::Surface(&local_228,iVar19,iVar19);
  local_298._0_8_ = (pointer)0x0;
  local_298._8_8_ = (pointer)0x0;
  local_298._16_8_ = (pointer)0x0;
  local_258._16_8_ = (pointer)0x0;
  local_258._0_8_ = (pointer)0x0;
  local_258._8_8_ = (pointer)0x0;
  local_208.
  super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208.
  super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.
  super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8 = (undefined1  [8])0x3f800000;
  pp_Stack_1c0 = (_func_int **)0x3f80000000000000;
  local_1b8._M_allocated_capacity = 0x3f80000000000000;
  local_1b8._8_8_ = 0x3f80000000000000;
  local_1a8[0] = 0.0;
  local_1a8[1] = 0.0;
  local_1a8[2] = 1.0;
  local_1a8[3] = 1.0;
  deRandom_init((deRandom *)local_278,pLVar11->m_iteration * 1000 + pLVar11->m_primitive + 0x7b);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_298,6);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_258,6);
  if (0 < (int)((ulong)(local_298._8_8_ - local_298._0_8_) >> 4)) {
    lVar21 = 0;
    uVar23 = 0;
    do {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar23;
      fVar25 = deRandom_getFloat((deRandom *)local_278);
      *(float *)((long)(float *)local_298._0_8_ + lVar21) = fVar25 * 1.8 + -0.9;
      fVar25 = deRandom_getFloat((deRandom *)local_278);
      *(float *)((long)(float *)local_298._0_8_ + lVar21 + 4) = fVar25 * 1.8 + -0.9;
      *(undefined4 *)((long)(float *)local_298._0_8_ + lVar21 + 8) = 0;
      fVar25 = 1.0;
      if (pLVar11->m_projective == true) {
        fVar25 = deRandom_getFloat((deRandom *)local_278);
        fVar25 = fVar25 * 3.8 + 0.2;
        uVar5 = *(undefined8 *)((long)(float *)local_298._0_8_ + lVar21);
        *(ulong *)((long)(float *)local_298._0_8_ + lVar21) =
             CONCAT44(fVar25 * (float)((ulong)uVar5 >> 0x20),fVar25 * (float)uVar5);
        *(float *)((long)(float *)local_298._0_8_ + lVar21 + 8) =
             *(float *)((long)(float *)local_298._0_8_ + lVar21 + 8) * fVar25;
      }
      *(float *)((long)(float *)local_298._0_8_ + lVar21 + 0xc) = fVar25;
      uVar5 = *(undefined8 *)
               ((long)(local_1c8 +
                      lVar21 + (SUB168(auVar7 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0x1ffffffffffffffe)
                               * -0x18) + 8);
      puVar14 = (undefined8 *)((long)(float *)local_258._0_8_ + lVar21);
      *puVar14 = *(undefined8 *)
                  (local_1c8 +
                  lVar21 + (SUB168(auVar7 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0x1ffffffffffffffe) *
                           -0x18);
      puVar14[1] = uVar5;
      uVar23 = uVar23 + 1;
      lVar21 = lVar21 + 0x10;
    } while ((long)uVar23 < (long)(int)((ulong)(local_298._8_8_ - local_298._0_8_) >> 4));
  }
  GVar6 = pLVar11->m_primitive;
  if (GVar6 == 1) {
    if (0 < (int)((ulong)(local_298._8_8_ - local_298._0_8_) >> 4) + -1) {
      iVar19 = 0;
      do {
        local_1c8 = *(undefined1 (*) [8])((pointer)(local_298._0_8_ + (long)iVar19 * 0x10))->m_data;
        pp_Stack_1c0 = *(_func_int ***)
                        (((pointer)(local_298._0_8_ + (long)iVar19 * 0x10))->m_data + 2);
        local_1b8._M_allocated_capacity =
             *(undefined8 *)((pointer)(local_298._0_8_ + (long)(iVar19 + 1) * 0x10))->m_data;
        local_1b8._8_8_ =
             *(undefined8 *)(((pointer)(local_298._0_8_ + (long)(iVar19 + 1) * 0x10))->m_data + 2);
        local_1a8._0_8_ = *(undefined8 *)((pointer)(local_258._0_8_ + (long)iVar19 * 0x10))->m_data;
        local_1a8._8_8_ =
             *(undefined8 *)(((pointer)(local_258._0_8_ + (long)iVar19 * 0x10))->m_data + 2);
        local_1a8._16_8_ =
             *(undefined8 *)((pointer)(local_258._0_8_ + (long)(iVar19 + 1) * 0x10))->m_data;
        afStack_190._0_8_ =
             *(undefined8 *)(((pointer)(local_258._0_8_ + (long)(iVar19 + 1) * 0x10))->m_data + 2);
        std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
        push_back(&local_208,(value_type *)local_1c8);
        iVar19 = iVar19 + 2;
      } while (iVar19 < (int)((ulong)(local_298._8_8_ - local_298._0_8_) >> 4) + -1);
    }
  }
  else if (GVar6 == 3) {
    if (0 < (int)((ulong)(local_298._8_8_ - local_298._0_8_) >> 4) + -1) {
      lVar21 = 0x10;
      lVar22 = 0;
      do {
        pfVar4 = (float *)((long)((pointer)(local_298._0_8_ + -0x10))->m_data + lVar21);
        local_1c8 = *(undefined1 (*) [8])pfVar4;
        pp_Stack_1c0 = *(_func_int ***)(pfVar4 + 2);
        psVar1 = (size_type *)((long)(float *)local_298._0_8_ + lVar21);
        local_1b8._M_allocated_capacity = *psVar1;
        local_1b8._8_8_ = psVar1[1];
        pfVar4 = (float *)((long)((pointer)(local_258._0_8_ + -0x10))->m_data + lVar21);
        local_1a8._0_8_ = *(undefined8 *)pfVar4;
        local_1a8._8_8_ = *(undefined8 *)(pfVar4 + 2);
        pfVar4 = (float *)((long)(float *)local_258._0_8_ + lVar21);
        local_1a8._16_8_ = *(undefined8 *)pfVar4;
        afStack_190._0_8_ = *(undefined8 *)(pfVar4 + 2);
        std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
        push_back(&local_208,(value_type *)local_1c8);
        lVar22 = lVar22 + 1;
        lVar21 = lVar21 + 0x10;
      } while (lVar22 < (local_298._8_8_ - local_298._0_8_) * 0x10000000 + -0x100000000 >> 0x20);
    }
  }
  else if ((GVar6 == 2) &&
          (uVar23 = (ulong)(local_298._8_8_ - local_298._0_8_) >> 4, 0 < (int)uVar23)) {
    iVar19 = 0;
    do {
      uVar18 = (long)iVar19 % (long)(int)uVar23 & 0xffffffff;
      local_1c8 = *(undefined1 (*) [8])((pointer)(local_298._0_8_ + uVar18 * 0x10))->m_data;
      pp_Stack_1c0 = *(_func_int ***)(((pointer)(local_298._0_8_ + uVar18 * 0x10))->m_data + 2);
      iVar19 = iVar19 + 1;
      uVar23 = (long)iVar19 % (long)(int)uVar23 & 0xffffffff;
      local_1b8._M_allocated_capacity =
           *(undefined8 *)((pointer)(local_298._0_8_ + uVar23 * 0x10))->m_data;
      local_1b8._8_8_ = *(undefined8 *)(((pointer)(local_298._0_8_ + uVar23 * 0x10))->m_data + 2);
      local_1a8._0_8_ = *(undefined8 *)((pointer)(local_258._0_8_ + uVar18 * 0x10))->m_data;
      local_1a8._8_8_ = *(undefined8 *)(((pointer)(local_258._0_8_ + uVar18 * 0x10))->m_data + 2);
      local_1a8._16_8_ = *(undefined8 *)((pointer)(local_258._0_8_ + uVar23 * 0x10))->m_data;
      afStack_190._0_8_ = *(undefined8 *)(((pointer)(local_258._0_8_ + uVar23 * 0x10))->m_data + 2);
      std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
      push_back(&local_208,(value_type *)local_1c8);
      uVar23 = (ulong)(local_298._8_8_ - local_298._0_8_) >> 4;
    } while (iVar19 < (int)uVar23);
  }
  local_1c8 = (undefined1  [8])
              ((local_230->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1c0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pp_Stack_1c0,"Generated vertices:",0x13);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1c0);
  std::ios_base::~ios_base(local_150);
  if (0 < (int)((ulong)(local_298._8_8_ - local_298._0_8_) >> 4)) {
    lVar21 = 0;
    lVar22 = 0;
    do {
      local_1c8 = (undefined1  [8])
                  ((local_230->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode
                  .m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1c0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1c0,"\t",1);
      tcu::operator<<((ostream *)&pp_Stack_1c0,
                      (Vector<float,_4> *)((long)(float *)local_298._0_8_ + lVar21));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1c0,",\tcolor= ",9);
      tcu::operator<<((ostream *)&pp_Stack_1c0,
                      (Vector<float,_4> *)((long)(float *)local_258._0_8_ + lVar21));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1c0);
      std::ios_base::~ios_base(local_150);
      lVar22 = lVar22 + 1;
      lVar21 = lVar21 + 0x10;
    } while (lVar22 < (int)((ulong)(local_298._8_8_ - local_298._0_8_) >> 4));
  }
  pLVar11 = local_230;
  BaseRenderingCase::drawPrimitives
            (&local_230->super_BaseRenderingCase,&local_228,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_298,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_258,
             local_230->m_primitive);
  local_278._0_8_ = (pointer)0x0;
  local_278._8_8_ = (pointer)0x0;
  local_278._16_8_ = 0;
  local_48.numSamples = (pLVar11->super_BaseRenderingCase).m_numSamples;
  local_48.subpixelBits = (pLVar11->super_BaseRenderingCase).m_subpixelBits;
  pRVar15 = Context::getRenderTarget((pLVar11->super_BaseRenderingCase).super_TestCase.m_context);
  local_48.redBits = (pRVar15->m_pixelFormat).redBits;
  pRVar15 = Context::getRenderTarget((pLVar11->super_BaseRenderingCase).super_TestCase.m_context);
  local_48.greenBits = (pRVar15->m_pixelFormat).greenBits;
  pRVar15 = Context::getRenderTarget((pLVar11->super_BaseRenderingCase).super_TestCase.m_context);
  uVar10 = local_278._16_8_;
  uVar9 = local_278._8_8_;
  uVar5 = local_278._0_8_;
  local_48.blueBits = (pRVar15->m_pixelFormat).blueBits;
  local_278._16_8_ =
       local_208.
       super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_278._0_8_ =
       local_208.
       super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_278._8_8_ =
       local_208.
       super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_208.
  super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)uVar5;
  local_208.
  super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)uVar9;
  local_208.
  super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)uVar10;
  local_278._24_4_ = (pLVar11->super_BaseRenderingCase).m_lineWidth;
  LVar12 = tcu::verifyLineGroupInterpolation
                     (&local_228,(LineSceneSpec *)local_278,&local_48,
                      ((pLVar11->super_BaseRenderingCase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx)->m_log);
  if (LVar12 == LINEINTERPOLATION_STRICTLY_CORRECT) {
    local_1c8 = (undefined1  [8])&local_1b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"Pass","");
    tcu::ResultCollector::addResult(&pLVar11->m_result,QP_TEST_RESULT_PASS,(string *)local_1c8);
  }
  else if (LVar12 == LINEINTERPOLATION_PROJECTED) {
    local_1c8 = (undefined1  [8])
                ((pLVar11->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_1c0,
               "Interpolation was calculated using coordinates projected onto major axis. This method does not produce the same values as the non-projecting method defined in the specification."
               ,0xb1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1c0);
    std::ios_base::~ios_base(local_150);
    local_1c8 = (undefined1  [8])&local_1b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c8,"Interpolation was calculated using projected coordinateds","");
    tcu::ResultCollector::addResult
              (&pLVar11->m_result,QP_TEST_RESULT_QUALITY_WARNING,(string *)local_1c8);
  }
  else {
    if (LVar12 != LINEINTERPOLATION_INCORRECT) goto LAB_00f62926;
    if ((((float)local_278._24_4_ == 1.0) && (!NAN((float)local_278._24_4_))) ||
       ((pLVar11->super_BaseRenderingCase).m_numSamples < 2)) {
      local_1c8 = (undefined1  [8])&local_1b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c8,"Found invalid pixel values","");
      tcu::ResultCollector::addResult(&pLVar11->m_result,QP_TEST_RESULT_FAIL,(string *)local_1c8);
    }
    else {
      local_1c8 = (undefined1  [8])&local_1b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c8,"Interpolation of multisampled wide lines failed","");
      tcu::ResultCollector::addResult
                (&pLVar11->m_result,QP_TEST_RESULT_COMPATIBILITY_WARNING,(string *)local_1c8);
    }
  }
  if (local_1c8 != (undefined1  [8])&local_1b8) {
    operator_delete((void *)local_1c8,local_1b8._M_allocated_capacity + 1);
  }
LAB_00f62926:
  if ((pointer)local_278._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ - local_278._0_8_);
  }
  iVar19 = pLVar11->m_iteration + 1;
  pLVar11->m_iteration = iVar19;
  bVar24 = iVar19 != pLVar11->m_iterationCount;
  if (!bVar24) {
    tcu::ResultCollector::setTestContextResult
              (&pLVar11->m_result,
               (pLVar11->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx);
  }
  if (local_208.
      super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.
                    super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_208.
                          super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.
                          super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_258._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_258._0_8_,local_258._16_8_ - local_258._0_8_);
  }
  if ((pointer)local_298._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_298._0_8_,local_298._16_8_ - local_298._0_8_);
  }
  tcu::Surface::~Surface(&local_228);
  tcu::TestLog::endSection(local_1d0.m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  return (uint)bVar24;
}

Assistant:

LineInterpolationTest::IterateResult LineInterpolationTest::iterate (void)
{
	const std::string						iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection				section					(m_testCtx.getLog(), "Iteration" + de::toString(m_iteration+1), iterationDescription);
	tcu::Surface							resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>					drawBuffer;
	std::vector<tcu::Vec4>					colorBuffer;
	std::vector<LineSceneSpec::SceneLine>	lines;

	// generate scene
	generateVertices(m_iteration, drawBuffer, colorBuffer);
	extractLines(lines, drawBuffer, colorBuffer);

	// log
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Generated vertices:" << tcu::TestLog::EndMessage;
		for (int vtxNdx = 0; vtxNdx < (int)drawBuffer.size(); ++vtxNdx)
			m_testCtx.getLog() << tcu::TestLog::Message << "\t" << drawBuffer[vtxNdx] << ",\tcolor= " << colorBuffer[vtxNdx] << tcu::TestLog::EndMessage;
	}

	// draw image
	drawPrimitives(resultImage, drawBuffer, colorBuffer, m_primitive);

	// compare
	{
		RasterizationArguments	args;
		LineSceneSpec			scene;
		LineInterpolationMethod	iterationResult;

		args.numSamples		= m_numSamples;
		args.subpixelBits	= m_subpixelBits;
		args.redBits		= m_context.getRenderTarget().getPixelFormat().redBits;
		args.greenBits		= m_context.getRenderTarget().getPixelFormat().greenBits;
		args.blueBits		= m_context.getRenderTarget().getPixelFormat().blueBits;

		scene.lines.swap(lines);
		scene.lineWidth = m_lineWidth;

		iterationResult = verifyLineGroupInterpolation(resultImage, scene, args, m_testCtx.getLog());
		switch (iterationResult)
		{
			case tcu::LINEINTERPOLATION_STRICTLY_CORRECT:
				// line interpolation matches the specification
				m_result.addResult(QP_TEST_RESULT_PASS, "Pass");
				break;

			case tcu::LINEINTERPOLATION_PROJECTED:
				// line interpolation weights are otherwise correct, but they are projected onto major axis
				m_testCtx.getLog()	<< tcu::TestLog::Message
									<< "Interpolation was calculated using coordinates projected onto major axis. "
									   "This method does not produce the same values as the non-projecting method defined in the specification."
									<< tcu::TestLog::EndMessage;
				m_result.addResult(QP_TEST_RESULT_QUALITY_WARNING, "Interpolation was calculated using projected coordinateds");
				break;

			case tcu::LINEINTERPOLATION_INCORRECT:
				if (scene.lineWidth != 1.0f && m_numSamples > 1)
				{
					// multisampled wide lines might not be supported
					m_result.addResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Interpolation of multisampled wide lines failed");
				}
				else
				{
					// line interpolation is incorrect
					m_result.addResult(QP_TEST_RESULT_FAIL, "Found invalid pixel values");
				}
				break;

			default:
				DE_ASSERT(false);
				break;
		}
	}

	// result
	if (++m_iteration == m_iterationCount)
	{
		m_result.setTestContextResult(m_testCtx);
		return STOP;
	}
	else
		return CONTINUE;
}